

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O1

void cJump(item *x)

{
  uint uVar1;
  typeDesc *ptVar2;
  int op;
  
  ptVar2 = getType(x->typeIndex);
  if (ptVar2->form == 0x325) {
    if (x->mode != 0x2c3) {
      loadBool(x);
    }
    uVar1 = x->c - 0x66;
    op = 0;
    if (uVar1 < 6) {
      op = *(int *)(&DAT_0010a3d0 + (ulong)uVar1 * 4);
    }
    put(op,x->r,0,x->a);
    regs[x->r] = 0;
    fixLink(x->b);
    x->a = pc + -1;
    return;
  }
  mark("boolean ?");
  exit(-1);
}

Assistant:

procedure
void cJump(struct item *x) {
	variable int riscOp;
	variable struct typeDesc *type;
	type = NULL;
	riscOp = 0;
	type = getType(x->typeIndex);
	if (type->form == FORM_BOOL) {
		if (x->mode != CLASS_COND) {
			loadBool(x);
		}
		riscOp = selectOpNegated(x->c);
		put(riscOp,x->r,0,x->a);
		regs[x->r] = 0;
		fixLink(x->b);
		x->a = pc - 1;
	} else {
		mark("boolean ?");
		exit(-1);
	}
}